

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O2

bool embree::avx512::ConeCurveMiIntersectorK<8,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *line)

{
  int iVar1;
  float fVar9;
  float fVar10;
  undefined4 uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  Scene *pSVar20;
  Geometry *pGVar21;
  long lVar22;
  RTCFilterFunctionN p_Var23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  bool bVar53;
  bool bVar54;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  ulong uVar74;
  byte bVar75;
  byte bVar76;
  byte bVar77;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  bool bVar82;
  ulong uVar83;
  byte bVar84;
  byte bVar85;
  ulong uVar86;
  ulong uVar87;
  ulong uVar88;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar89 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [64];
  undefined1 auVar139 [32];
  undefined1 auVar140 [64];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [32];
  undefined1 auVar146 [64];
  undefined1 auVar147 [32];
  undefined1 auVar148 [64];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  undefined1 auVar165 [64];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  undefined1 auVar168 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar169 [64];
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<8> hit;
  undefined1 local_5b0 [16];
  RayK<4> *local_598;
  RTCFilterFunctionNArguments local_590;
  undefined1 local_560 [16];
  RTCHitN local_550 [16];
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  uint local_4e0;
  uint uStack_4dc;
  uint uStack_4d8;
  uint uStack_4d4;
  uint uStack_4d0;
  uint uStack_4cc;
  uint uStack_4c8;
  uint uStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar152 [64];
  
  pSVar20 = context->scene;
  pGVar21 = (pSVar20->geometries).items[line->sharedGeomID].ptr;
  uVar12 = (line->v0).field_0.i[0];
  lVar22 = *(long *)&pGVar21[1].time_range.upper;
  p_Var23 = pGVar21[1].intersectionFilterN;
  uVar13 = (line->v0).field_0.i[1];
  uVar14 = (line->v0).field_0.i[2];
  uVar15 = (line->v0).field_0.i[3];
  uVar16 = (line->v0).field_0.i[4];
  auVar101._16_16_ = *(undefined1 (*) [16])(lVar22 + (ulong)uVar16 * (long)p_Var23);
  auVar101._0_16_ = *(undefined1 (*) [16])(lVar22 + (ulong)uVar12 * (long)p_Var23);
  uVar17 = (line->v0).field_0.i[5];
  auVar124._16_16_ = *(undefined1 (*) [16])(lVar22 + (ulong)uVar17 * (long)p_Var23);
  auVar124._0_16_ = *(undefined1 (*) [16])(lVar22 + (ulong)uVar13 * (long)p_Var23);
  uVar18 = (line->v0).field_0.i[6];
  auVar106._16_16_ = *(undefined1 (*) [16])(lVar22 + (ulong)uVar18 * (long)p_Var23);
  auVar106._0_16_ = *(undefined1 (*) [16])(lVar22 + (ulong)uVar14 * (long)p_Var23);
  uVar19 = (line->v0).field_0.i[7];
  auVar102._16_16_ = *(undefined1 (*) [16])(lVar22 + (ulong)uVar19 * (long)p_Var23);
  auVar102._0_16_ = *(undefined1 (*) [16])(lVar22 + (ulong)uVar15 * (long)p_Var23);
  auVar89 = *(undefined1 (*) [16])(lVar22 + (ulong)(uVar16 + 1) * (long)p_Var23);
  auVar112._0_16_ =
       ZEXT116(0) * auVar89 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar22 + (ulong)(uVar12 + 1) * (long)p_Var23);
  auVar112._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar89;
  auVar89 = *(undefined1 (*) [16])(lVar22 + (ulong)(uVar17 + 1) * (long)p_Var23);
  auVar117._0_16_ =
       ZEXT116(0) * auVar89 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar22 + (ulong)(uVar13 + 1) * (long)p_Var23);
  auVar117._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar89;
  auVar89 = *(undefined1 (*) [16])(lVar22 + (ulong)(uVar18 + 1) * (long)p_Var23);
  auVar113._0_16_ =
       ZEXT116(0) * auVar89 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar22 + (ulong)(uVar14 + 1) * (long)p_Var23);
  auVar113._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar89;
  auVar89 = *(undefined1 (*) [16])(lVar22 + (ulong)(uVar19 + 1) * (long)p_Var23);
  auVar92._0_16_ =
       ZEXT116(0) * auVar89 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar22 + (ulong)(uVar15 + 1) * (long)p_Var23);
  auVar92._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar89;
  local_100 = vpbroadcastd_avx512vl();
  auVar98 = vunpcklps_avx(auVar101,auVar106);
  auVar96 = vunpckhps_avx(auVar101,auVar106);
  auVar101 = vunpcklps_avx(auVar124,auVar102);
  auVar97 = vunpckhps_avx(auVar124,auVar102);
  auVar106 = vunpcklps_avx(auVar98,auVar101);
  auVar101 = vunpckhps_avx(auVar98,auVar101);
  auVar102 = vunpcklps_avx(auVar96,auVar97);
  auVar124 = vunpckhps_avx(auVar96,auVar97);
  auVar98 = vpunpckldq_avx2(auVar112,auVar113);
  auVar96 = vpunpckhdq_avx2(auVar112,auVar113);
  auVar112 = vpunpckldq_avx2(auVar117,auVar92);
  auVar97 = vpunpckhdq_avx2(auVar117,auVar92);
  auVar117 = vpunpckldq_avx2(auVar98,auVar112);
  auVar112 = vpunpckhdq_avx2(auVar98,auVar112);
  auVar113 = vpunpckldq_avx2(auVar96,auVar97);
  auVar92 = vpunpckhdq_avx512vl(auVar96,auVar97);
  auVar96 = vpcmpeqd_avx2(auVar98,auVar98);
  uVar74 = vpcmpd_avx512vl(auVar96,(undefined1  [32])(line->primIDs).field_0,4);
  fVar9 = *(float *)(ray + k * 4);
  auVar100._4_4_ = fVar9;
  auVar100._0_4_ = fVar9;
  auVar100._8_4_ = fVar9;
  auVar100._12_4_ = fVar9;
  auVar100._16_4_ = fVar9;
  auVar100._20_4_ = fVar9;
  auVar100._24_4_ = fVar9;
  auVar100._28_4_ = fVar9;
  fVar10 = *(float *)(ray + k * 4 + 0x10);
  auVar103._4_4_ = fVar10;
  auVar103._0_4_ = fVar10;
  auVar103._8_4_ = fVar10;
  auVar103._12_4_ = fVar10;
  auVar103._16_4_ = fVar10;
  auVar103._20_4_ = fVar10;
  auVar103._24_4_ = fVar10;
  auVar103._28_4_ = fVar10;
  uVar11 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar104._4_4_ = uVar11;
  auVar104._0_4_ = uVar11;
  auVar104._8_4_ = uVar11;
  auVar104._12_4_ = uVar11;
  auVar104._16_4_ = uVar11;
  auVar104._20_4_ = uVar11;
  auVar104._24_4_ = uVar11;
  auVar104._28_4_ = uVar11;
  auVar93 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
  auVar162 = ZEXT3264(auVar93);
  auVar94 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
  auVar163 = ZEXT3264(auVar94);
  auVar95 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
  auVar164 = ZEXT3264(auVar95);
  auVar89 = vmulss_avx512f(auVar95._0_16_,auVar95._0_16_);
  auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar94,auVar94);
  auVar96 = vfmadd231ps_avx512vl(auVar96,auVar93,auVar93);
  auVar98._0_4_ = auVar96._0_4_;
  auVar98._4_4_ = auVar98._0_4_;
  auVar98._8_4_ = auVar98._0_4_;
  auVar98._12_4_ = auVar98._0_4_;
  auVar98._16_4_ = auVar98._0_4_;
  auVar98._20_4_ = auVar98._0_4_;
  auVar98._24_4_ = auVar98._0_4_;
  auVar98._28_4_ = auVar98._0_4_;
  auVar97 = vrcp14ps_avx512vl(auVar98);
  auVar90 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
  auVar96._8_4_ = 0x3f800000;
  auVar96._0_8_ = 0x3f8000003f800000;
  auVar96._12_4_ = 0x3f800000;
  auVar96._16_4_ = 0x3f800000;
  auVar96._20_4_ = 0x3f800000;
  auVar96._24_4_ = 0x3f800000;
  auVar96._28_4_ = 0x3f800000;
  auVar96 = vfnmadd213ps_avx512vl(auVar98,auVar97,auVar96);
  auVar89 = vfmadd132ps_fma(auVar96,auVar97,auVar97);
  auVar99._0_4_ = auVar106._0_4_ + auVar117._0_4_;
  auVar99._4_4_ = auVar106._4_4_ + auVar117._4_4_;
  auVar99._8_4_ = auVar106._8_4_ + auVar117._8_4_;
  auVar99._12_4_ = auVar106._12_4_ + auVar117._12_4_;
  auVar99._16_4_ = auVar106._16_4_ + auVar117._16_4_;
  auVar99._20_4_ = auVar106._20_4_ + auVar117._20_4_;
  auVar99._24_4_ = auVar106._24_4_ + auVar117._24_4_;
  auVar99._28_4_ = auVar106._28_4_ + auVar117._28_4_;
  auVar105._0_4_ = auVar112._0_4_ + auVar101._0_4_;
  auVar105._4_4_ = auVar112._4_4_ + auVar101._4_4_;
  auVar105._8_4_ = auVar112._8_4_ + auVar101._8_4_;
  auVar105._12_4_ = auVar112._12_4_ + auVar101._12_4_;
  auVar105._16_4_ = auVar112._16_4_ + auVar101._16_4_;
  auVar105._20_4_ = auVar112._20_4_ + auVar101._20_4_;
  auVar105._24_4_ = auVar112._24_4_ + auVar101._24_4_;
  auVar105._28_4_ = auVar112._28_4_ + auVar101._28_4_;
  auVar107._0_4_ = auVar102._0_4_ + auVar113._0_4_;
  auVar107._4_4_ = auVar102._4_4_ + auVar113._4_4_;
  auVar107._8_4_ = auVar102._8_4_ + auVar113._8_4_;
  auVar107._12_4_ = auVar102._12_4_ + auVar113._12_4_;
  auVar107._16_4_ = auVar102._16_4_ + auVar113._16_4_;
  auVar107._20_4_ = auVar102._20_4_ + auVar113._20_4_;
  auVar107._24_4_ = auVar102._24_4_ + auVar113._24_4_;
  auVar107._28_4_ = auVar102._28_4_ + auVar113._28_4_;
  auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar97 = vmulps_avx512vl(auVar99,auVar96);
  auVar98 = vmulps_avx512vl(auVar105,auVar96);
  auVar99 = vmulps_avx512vl(auVar107,auVar96);
  auVar96 = vsubps_avx(auVar97,auVar100);
  auVar97 = vsubps_avx(auVar98,auVar103);
  auVar98 = vsubps_avx(auVar99,auVar104);
  auVar98 = vmulps_avx512vl(auVar98,auVar95);
  auVar97 = vfmadd231ps_avx512vl(auVar98,auVar94,auVar97);
  auVar96 = vfmadd231ps_avx512vl(auVar97,auVar93,auVar96);
  auVar129._0_4_ = auVar96._0_4_ * auVar89._0_4_;
  auVar129._4_4_ = auVar96._4_4_ * auVar89._4_4_;
  auVar129._8_4_ = auVar96._8_4_ * auVar89._8_4_;
  auVar129._12_4_ = auVar96._12_4_ * auVar89._12_4_;
  auVar129._16_4_ = auVar96._16_4_ * 0.0;
  auVar129._20_4_ = auVar96._20_4_ * 0.0;
  auVar129._24_4_ = auVar96._24_4_ * 0.0;
  auVar129._28_4_ = 0;
  auVar96 = vmulps_avx512vl(auVar93,auVar129);
  auVar97 = vmulps_avx512vl(auVar94,auVar129);
  auVar98 = vmulps_avx512vl(auVar95,auVar129);
  auVar149._0_4_ = auVar96._0_4_ + fVar9;
  auVar149._4_4_ = auVar96._4_4_ + fVar9;
  auVar149._8_4_ = auVar96._8_4_ + fVar9;
  auVar149._12_4_ = auVar96._12_4_ + fVar9;
  auVar149._16_4_ = auVar96._16_4_ + fVar9;
  auVar149._20_4_ = auVar96._20_4_ + fVar9;
  auVar149._24_4_ = auVar96._24_4_ + fVar9;
  auVar149._28_4_ = auVar96._28_4_ + fVar9;
  auVar153._0_4_ = fVar10 + auVar97._0_4_;
  auVar153._4_4_ = fVar10 + auVar97._4_4_;
  auVar153._8_4_ = fVar10 + auVar97._8_4_;
  auVar153._12_4_ = fVar10 + auVar97._12_4_;
  auVar153._16_4_ = fVar10 + auVar97._16_4_;
  auVar153._20_4_ = fVar10 + auVar97._20_4_;
  auVar153._24_4_ = fVar10 + auVar97._24_4_;
  auVar153._28_4_ = fVar10 + auVar97._28_4_;
  auVar96 = vaddps_avx512vl(auVar104,auVar98);
  auVar98 = vsubps_avx512vl(auVar117,auVar106);
  auVar165 = ZEXT3264(auVar98);
  auVar99 = vsubps_avx512vl(auVar112,auVar101);
  auVar166 = ZEXT3264(auVar99);
  auVar100 = vsubps_avx512vl(auVar113,auVar102);
  auVar167 = ZEXT3264(auVar100);
  _local_480 = vsubps_avx(auVar149,auVar106);
  auVar101 = vsubps_avx512vl(auVar153,auVar101);
  auVar168 = ZEXT3264(auVar101);
  _local_4a0 = vsubps_avx512vl(auVar96,auVar102);
  auVar97 = vmulps_avx512vl(auVar100,auVar100);
  auVar97 = vfmadd231ps_avx512vl(auVar97,auVar99,auVar99);
  auVar102 = vfmadd231ps_avx512vl(auVar97,auVar98,auVar98);
  auVar97 = vmulps_avx512vl(auVar100,_local_4a0);
  auVar97 = vfmadd231ps_avx512vl(auVar97,auVar101,auVar99);
  auVar103 = vfmadd231ps_avx512vl(auVar97,_local_480,auVar98);
  auVar97 = vmulps_avx512vl(auVar100,auVar95);
  auVar97 = vfmadd231ps_avx512vl(auVar97,auVar94,auVar99);
  auVar104 = vfmadd231ps_avx512vl(auVar97,auVar93,auVar98);
  auVar105 = vsubps_avx512vl(auVar124,auVar92);
  fVar9 = auVar105._0_4_;
  fVar58 = auVar105._4_4_;
  fVar60 = auVar105._8_4_;
  fVar62 = auVar105._12_4_;
  fVar64 = auVar105._16_4_;
  fVar66 = auVar105._20_4_;
  fVar68 = auVar105._24_4_;
  auVar132._0_4_ = fVar9 * fVar9 + auVar102._0_4_;
  auVar132._4_4_ = fVar58 * fVar58 + auVar102._4_4_;
  auVar132._8_4_ = fVar60 * fVar60 + auVar102._8_4_;
  auVar132._12_4_ = fVar62 * fVar62 + auVar102._12_4_;
  auVar132._16_4_ = fVar64 * fVar64 + auVar102._16_4_;
  auVar132._20_4_ = fVar66 * fVar66 + auVar102._20_4_;
  auVar132._24_4_ = fVar68 * fVar68 + auVar102._24_4_;
  auVar132._28_4_ = auVar106._28_4_ + auVar102._28_4_;
  auVar97 = vmulps_avx512vl(auVar95,_local_4a0);
  auVar97 = vfmadd231ps_avx512vl(auVar97,auVar94,auVar101);
  auVar106 = vfmadd231ps_avx512vl(auVar97,auVar93,_local_480);
  auVar97 = vmulps_avx512vl(_local_4a0,_local_4a0);
  auVar97 = vfmadd231ps_avx512vl(auVar97,auVar101,auVar101);
  auVar107 = vfmadd231ps_avx512vl(auVar97,_local_480,_local_480);
  auVar108 = vmulps_avx512vl(auVar102,auVar102);
  auVar169 = ZEXT3264(auVar108);
  auVar109 = vmulps_avx512vl(auVar124,auVar102);
  fVar10 = auVar104._0_4_;
  fVar59 = auVar104._4_4_;
  auVar97._4_4_ = fVar59 * fVar59;
  auVar97._0_4_ = fVar10 * fVar10;
  fVar61 = auVar104._8_4_;
  auVar97._8_4_ = fVar61 * fVar61;
  fVar63 = auVar104._12_4_;
  auVar97._12_4_ = fVar63 * fVar63;
  fVar65 = auVar104._16_4_;
  auVar97._16_4_ = fVar65 * fVar65;
  fVar67 = auVar104._20_4_;
  auVar97._20_4_ = fVar67 * fVar67;
  fVar69 = auVar104._24_4_;
  auVar97._24_4_ = fVar69 * fVar69;
  auVar97._28_4_ = local_4a0._28_4_;
  auVar110 = vmulps_avx512vl(auVar132,auVar97);
  auVar110 = vsubps_avx512vl(auVar108,auVar110);
  auVar106 = vmulps_avx512vl(auVar108,auVar106);
  auVar111 = vmulps_avx512vl(auVar104,auVar103);
  auVar111 = vmulps_avx512vl(auVar132,auVar111);
  auVar106 = vsubps_avx512vl(auVar106,auVar111);
  auVar111 = vmulps_avx512vl(auVar105,auVar104);
  auVar111 = vmulps_avx512vl(auVar109,auVar111);
  auVar106 = vaddps_avx512vl(auVar111,auVar106);
  auVar107 = vmulps_avx512vl(auVar108,auVar107);
  auVar111 = vmulps_avx512vl(auVar103,auVar103);
  auVar111 = vmulps_avx512vl(auVar132,auVar111);
  auVar107 = vsubps_avx512vl(auVar107,auVar111);
  auVar105 = vaddps_avx512vl(auVar105,auVar105);
  auVar105 = vmulps_avx512vl(auVar105,auVar103);
  auVar105 = vsubps_avx512vl(auVar105,auVar109);
  auVar105 = vmulps_avx512vl(auVar109,auVar105);
  auVar105 = vaddps_avx512vl(auVar107,auVar105);
  auVar107 = vmulps_avx512vl(auVar106,auVar106);
  auVar105 = vmulps_avx512vl(auVar110,auVar105);
  auVar105 = vsubps_avx512vl(auVar107,auVar105);
  uVar83 = vcmpps_avx512vl(auVar105,ZEXT1632(auVar90),5);
  bVar85 = (byte)(uVar74 & uVar83);
  if (bVar85 != 0) {
    auVar117 = vsubps_avx(auVar149,auVar117);
    auVar112 = vsubps_avx512vl(auVar153,auVar112);
    auVar113 = vsubps_avx512vl(auVar96,auVar113);
    auVar105 = vsqrtps_avx512vl(auVar105);
    auVar96 = vrcp14ps_avx512vl(auVar110);
    auVar136._8_4_ = 0x3f800000;
    auVar136._0_8_ = 0x3f8000003f800000;
    auVar136._12_4_ = 0x3f800000;
    auVar136._16_4_ = 0x3f800000;
    auVar136._20_4_ = 0x3f800000;
    auVar136._24_4_ = 0x3f800000;
    auVar136._28_4_ = 0x3f800000;
    auVar107 = vfnmadd213ps_avx512vl(auVar96,auVar110,auVar136);
    auVar89 = vfmadd132ps_fma(auVar107,auVar96,auVar96);
    auVar109._8_4_ = 0x7fffffff;
    auVar109._0_8_ = 0x7fffffff7fffffff;
    auVar109._12_4_ = 0x7fffffff;
    auVar109._16_4_ = 0x7fffffff;
    auVar109._20_4_ = 0x7fffffff;
    auVar109._24_4_ = 0x7fffffff;
    auVar109._28_4_ = 0x7fffffff;
    vandps_avx512vl(auVar110,auVar109);
    auVar110._8_4_ = 0x219392ef;
    auVar110._0_8_ = 0x219392ef219392ef;
    auVar110._12_4_ = 0x219392ef;
    auVar110._16_4_ = 0x219392ef;
    auVar110._20_4_ = 0x219392ef;
    auVar110._24_4_ = 0x219392ef;
    auVar110._28_4_ = 0x219392ef;
    uVar87 = vcmpps_avx512vl(auVar107,auVar110,2);
    auVar135._8_4_ = 0x80000000;
    auVar135._0_8_ = 0x8000000080000000;
    auVar135._12_4_ = 0x80000000;
    auVar135._16_4_ = 0x80000000;
    auVar135._20_4_ = 0x80000000;
    auVar135._24_4_ = 0x80000000;
    auVar135._28_4_ = 0x80000000;
    auVar96 = vxorps_avx512vl(auVar106,auVar135);
    auVar96 = vsubps_avx(auVar96,auVar105);
    auVar96 = vmulps_avx512vl(auVar96,ZEXT1632(auVar89));
    auVar145._8_4_ = 0xff800000;
    auVar145._0_8_ = 0xff800000ff800000;
    auVar145._12_4_ = 0xff800000;
    auVar145._16_4_ = 0xff800000;
    auVar145._20_4_ = 0xff800000;
    auVar145._24_4_ = 0xff800000;
    auVar145._28_4_ = 0xff800000;
    bVar82 = (bool)((byte)uVar87 & 1);
    auVar114._0_4_ = (uint)bVar82 * -0x800000 | (uint)!bVar82 * auVar96._0_4_;
    bVar82 = (bool)((byte)(uVar87 >> 1) & 1);
    auVar114._4_4_ = (uint)bVar82 * -0x800000 | (uint)!bVar82 * auVar96._4_4_;
    bVar82 = (bool)((byte)(uVar87 >> 2) & 1);
    auVar114._8_4_ = (uint)bVar82 * -0x800000 | (uint)!bVar82 * auVar96._8_4_;
    bVar82 = (bool)((byte)(uVar87 >> 3) & 1);
    auVar114._12_4_ = (uint)bVar82 * -0x800000 | (uint)!bVar82 * auVar96._12_4_;
    bVar82 = (bool)((byte)(uVar87 >> 4) & 1);
    auVar114._16_4_ = (uint)bVar82 * -0x800000 | (uint)!bVar82 * auVar96._16_4_;
    bVar82 = (bool)((byte)(uVar87 >> 5) & 1);
    auVar114._20_4_ = (uint)bVar82 * -0x800000 | (uint)!bVar82 * auVar96._20_4_;
    bVar82 = (bool)((byte)(uVar87 >> 6) & 1);
    auVar114._24_4_ = (uint)bVar82 * -0x800000 | (uint)!bVar82 * auVar96._24_4_;
    bVar82 = SUB81(uVar87 >> 7,0);
    auVar114._28_4_ = (uint)bVar82 * -0x800000 | (uint)!bVar82 * auVar96._28_4_;
    auVar96 = vsubps_avx512vl(auVar105,auVar106);
    auVar150._8_4_ = 0x7f800000;
    auVar150._0_8_ = 0x7f8000007f800000;
    auVar150._12_4_ = 0x7f800000;
    auVar150._16_4_ = 0x7f800000;
    auVar150._20_4_ = 0x7f800000;
    auVar150._24_4_ = 0x7f800000;
    auVar150._28_4_ = 0x7f800000;
    bVar82 = (bool)((byte)uVar87 & 1);
    auVar115._0_4_ =
         (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)(auVar96._0_4_ * auVar89._0_4_);
    bVar82 = (bool)((byte)(uVar87 >> 1) & 1);
    auVar115._4_4_ =
         (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)(auVar96._4_4_ * auVar89._4_4_);
    bVar82 = (bool)((byte)(uVar87 >> 2) & 1);
    auVar115._8_4_ =
         (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)(auVar96._8_4_ * auVar89._8_4_);
    bVar82 = (bool)((byte)(uVar87 >> 3) & 1);
    auVar115._12_4_ =
         (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)(auVar96._12_4_ * auVar89._12_4_);
    bVar82 = (bool)((byte)(uVar87 >> 4) & 1);
    auVar115._16_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)(auVar96._16_4_ * 0.0);
    bVar82 = (bool)((byte)(uVar87 >> 5) & 1);
    auVar115._20_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)(auVar96._20_4_ * 0.0);
    bVar82 = (bool)((byte)(uVar87 >> 6) & 1);
    auVar115._24_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)(auVar96._24_4_ * 0.0);
    bVar82 = SUB81(uVar87 >> 7,0);
    auVar115._28_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)auVar153._28_4_;
    auVar111._4_4_ = fVar59 * (float)local_480._4_4_;
    auVar111._0_4_ = fVar10 * (float)local_480._0_4_;
    auVar111._8_4_ = fVar61 * fStack_478;
    auVar111._12_4_ = fVar63 * fStack_474;
    auVar111._16_4_ = fVar65 * fStack_470;
    auVar111._20_4_ = fVar67 * fStack_46c;
    auVar111._24_4_ = fVar69 * fStack_468;
    auVar111._28_4_ = auVar96._28_4_;
    auVar96 = vmulps_avx512vl(auVar104,auVar101);
    auVar106 = vmulps_avx512vl(auVar104,_local_4a0);
    auVar89 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
    auVar105 = vmulps_avx512vl(auVar93,auVar103);
    auVar105 = vsubps_avx512vl(auVar111,auVar105);
    auVar107 = vmulps_avx512vl(auVar94,auVar103);
    auVar96 = vsubps_avx512vl(auVar96,auVar107);
    auVar107 = vmulps_avx512vl(auVar95,auVar103);
    auVar106 = vsubps_avx512vl(auVar106,auVar107);
    auVar107 = vmulps_avx512vl(auVar104,auVar114);
    auVar147._0_4_ = auVar103._0_4_ + auVar107._0_4_;
    auVar147._4_4_ = auVar103._4_4_ + auVar107._4_4_;
    auVar147._8_4_ = auVar103._8_4_ + auVar107._8_4_;
    auVar147._12_4_ = auVar103._12_4_ + auVar107._12_4_;
    auVar147._16_4_ = auVar103._16_4_ + auVar107._16_4_;
    auVar147._20_4_ = auVar103._20_4_ + auVar107._20_4_;
    auVar147._24_4_ = auVar103._24_4_ + auVar107._24_4_;
    auVar147._28_4_ = auVar103._28_4_ + auVar107._28_4_;
    auVar106 = vmulps_avx512vl(auVar106,auVar106);
    auVar96 = vfmadd231ps_avx512vl(auVar106,auVar96,auVar96);
    auVar106 = vmulps_avx512vl(auVar104,auVar115);
    auVar106 = vaddps_avx512vl(auVar103,auVar106);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar105,auVar105);
    auVar105 = vmulps_avx512vl(auVar124,auVar124);
    auVar97 = vmulps_avx512vl(auVar105,auVar97);
    uVar87 = vcmpps_avx512vl(auVar96,auVar97,1);
    uVar87 = (bVar85 & ~(byte)line->leftExists) & uVar87;
    auVar96 = vrcp14ps_avx512vl(auVar104);
    auVar97 = vfnmadd213ps_avx512vl(auVar96,auVar104,auVar136);
    auVar96 = vfmadd132ps_avx512vl(auVar97,auVar96,auVar96);
    auVar159 = ZEXT3264(auVar106);
    auVar141._0_8_ = auVar103._0_8_ ^ 0x8000000080000000;
    auVar141._8_4_ = -auVar103._8_4_;
    auVar141._12_4_ = -auVar103._12_4_;
    auVar141._16_4_ = -auVar103._16_4_;
    auVar141._20_4_ = -auVar103._20_4_;
    auVar141._24_4_ = -auVar103._24_4_;
    auVar141._28_4_ = -auVar103._28_4_;
    auVar97 = vmulps_avx512vl(auVar96,auVar141);
    bVar82 = (bool)((byte)uVar87 & 1);
    auVar116._0_4_ = (uint)bVar82 * auVar97._0_4_ | (uint)!bVar82 * 0x7f800000;
    bVar82 = (bool)((byte)(uVar87 >> 1) & 1);
    auVar116._4_4_ = (uint)bVar82 * auVar97._4_4_ | (uint)!bVar82 * 0x7f800000;
    bVar82 = (bool)((byte)(uVar87 >> 2) & 1);
    auVar116._8_4_ = (uint)bVar82 * auVar97._8_4_ | (uint)!bVar82 * 0x7f800000;
    bVar82 = (bool)((byte)(uVar87 >> 3) & 1);
    auVar116._12_4_ = (uint)bVar82 * auVar97._12_4_ | (uint)!bVar82 * 0x7f800000;
    bVar82 = (bool)((byte)(uVar87 >> 4) & 1);
    auVar116._16_4_ = (uint)bVar82 * auVar97._16_4_ | (uint)!bVar82 * 0x7f800000;
    bVar82 = (bool)((byte)(uVar87 >> 5) & 1);
    auVar116._20_4_ = (uint)bVar82 * auVar97._20_4_ | (uint)!bVar82 * 0x7f800000;
    bVar82 = (bool)((byte)(uVar87 >> 6) & 1);
    auVar116._24_4_ = (uint)bVar82 * auVar97._24_4_ | (uint)!bVar82 * 0x7f800000;
    bVar82 = SUB81(uVar87 >> 7,0);
    auVar116._28_4_ = (uint)bVar82 * auVar97._28_4_ | (uint)!bVar82 * 0x7f800000;
    uVar70 = vcmpps_avx512vl(auVar147,auVar102,1);
    uVar71 = vcmpps_avx512vl(auVar147,ZEXT1632(auVar89),6);
    uVar72 = vcmpps_avx512vl(auVar106,auVar102,1);
    uVar73 = vcmpps_avx512vl(auVar106,ZEXT1632(auVar89),6);
    auVar97 = vmulps_avx512vl(auVar100,auVar113);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar112,auVar99);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar117,auVar98);
    auVar78._4_4_ = fVar59 * auVar117._4_4_;
    auVar78._0_4_ = fVar10 * auVar117._0_4_;
    auVar78._8_4_ = fVar61 * auVar117._8_4_;
    auVar78._12_4_ = fVar63 * auVar117._12_4_;
    auVar78._16_4_ = fVar65 * auVar117._16_4_;
    auVar78._20_4_ = fVar67 * auVar117._20_4_;
    auVar78._24_4_ = fVar69 * auVar117._24_4_;
    auVar78._28_4_ = auVar141._28_4_;
    auVar112 = vmulps_avx512vl(auVar104,auVar112);
    auVar117 = vmulps_avx512vl(auVar104,auVar113);
    auVar103 = vmulps_avx512vl(auVar93,auVar97);
    auVar103 = vsubps_avx512vl(auVar78,auVar103);
    auVar104 = vmulps_avx512vl(auVar94,auVar97);
    auVar112 = vsubps_avx512vl(auVar112,auVar104);
    auVar104 = vmulps_avx512vl(auVar95,auVar97);
    auVar117 = vsubps_avx512vl(auVar117,auVar104);
    auVar156 = ZEXT3264(auVar116);
    auVar79._4_4_ = auVar117._4_4_ * auVar117._4_4_;
    auVar79._0_4_ = auVar117._0_4_ * auVar117._0_4_;
    auVar79._8_4_ = auVar117._8_4_ * auVar117._8_4_;
    auVar79._12_4_ = auVar117._12_4_ * auVar117._12_4_;
    auVar79._16_4_ = auVar117._16_4_ * auVar117._16_4_;
    auVar79._20_4_ = auVar117._20_4_ * auVar117._20_4_;
    auVar79._24_4_ = auVar117._24_4_ * auVar117._24_4_;
    auVar79._28_4_ = auVar117._28_4_;
    auVar89 = vfmadd231ps_fma(auVar79,auVar112,auVar112);
    auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar103,auVar103);
    auVar112 = vmulps_avx512vl(auVar92,auVar92);
    auVar80._4_4_ = fVar59 * fVar59 * auVar112._4_4_;
    auVar80._0_4_ = fVar10 * fVar10 * auVar112._0_4_;
    auVar80._8_4_ = fVar61 * fVar61 * auVar112._8_4_;
    auVar80._12_4_ = fVar63 * fVar63 * auVar112._12_4_;
    auVar80._16_4_ = fVar65 * fVar65 * auVar112._16_4_;
    auVar80._20_4_ = fVar67 * fVar67 * auVar112._20_4_;
    auVar80._24_4_ = fVar69 * fVar69 * auVar112._24_4_;
    auVar80._28_4_ = auVar112._28_4_;
    uVar11 = *(undefined4 *)(ray + k * 4 + 0x30);
    auVar142._4_4_ = uVar11;
    auVar142._0_4_ = uVar11;
    auVar142._8_4_ = uVar11;
    auVar142._12_4_ = uVar11;
    auVar142._16_4_ = uVar11;
    auVar142._20_4_ = uVar11;
    auVar142._24_4_ = uVar11;
    auVar142._28_4_ = uVar11;
    bVar75 = (byte)uVar70 & (byte)uVar71 & bVar85;
    auVar112 = vblendmps_avx512vl(auVar150,auVar114);
    auVar118._0_4_ =
         (uint)(bVar75 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar113._0_4_;
    bVar82 = (bool)(bVar75 >> 1 & 1);
    auVar118._4_4_ = (uint)bVar82 * auVar112._4_4_ | (uint)!bVar82 * auVar113._4_4_;
    bVar82 = (bool)(bVar75 >> 2 & 1);
    auVar118._8_4_ = (uint)bVar82 * auVar112._8_4_ | (uint)!bVar82 * auVar113._8_4_;
    bVar82 = (bool)(bVar75 >> 3 & 1);
    auVar118._12_4_ = (uint)bVar82 * auVar112._12_4_ | (uint)!bVar82 * auVar113._12_4_;
    bVar82 = (bool)(bVar75 >> 4 & 1);
    auVar118._16_4_ = (uint)bVar82 * auVar112._16_4_ | (uint)!bVar82 * auVar113._16_4_;
    bVar82 = (bool)(bVar75 >> 5 & 1);
    auVar118._20_4_ = (uint)bVar82 * auVar112._20_4_ | (uint)!bVar82 * auVar113._20_4_;
    bVar82 = (bool)(bVar75 >> 6 & 1);
    auVar118._24_4_ = (uint)bVar82 * auVar112._24_4_ | (uint)!bVar82 * auVar113._24_4_;
    auVar118._28_4_ =
         (uint)(bVar75 >> 7) * auVar112._28_4_ | (uint)!(bool)(bVar75 >> 7) * auVar113._28_4_;
    auVar157 = ZEXT3264(auVar118);
    auVar137._0_8_ = auVar97._0_8_ ^ 0x8000000080000000;
    auVar137._8_4_ = auVar97._8_4_ ^ 0x80000000;
    auVar137._12_4_ = auVar97._12_4_ ^ 0x80000000;
    auVar137._16_4_ = auVar97._16_4_ ^ 0x80000000;
    auVar137._20_4_ = auVar97._20_4_ ^ 0x80000000;
    auVar137._24_4_ = auVar97._24_4_ ^ 0x80000000;
    auVar137._28_4_ = auVar97._28_4_ ^ 0x80000000;
    uVar87 = vcmpps_avx512vl(ZEXT1632(auVar89),auVar80,1);
    uVar87 = (bVar85 & ~(byte)line->rightExists) & uVar87;
    auVar96 = vmulps_avx512vl(auVar96,auVar137);
    bVar82 = (bool)((byte)uVar87 & 1);
    auVar119._0_4_ = (uint)bVar82 * auVar96._0_4_ | (uint)!bVar82 * 0x7f800000;
    bVar82 = (bool)((byte)(uVar87 >> 1) & 1);
    auVar119._4_4_ = (uint)bVar82 * auVar96._4_4_ | (uint)!bVar82 * 0x7f800000;
    bVar82 = (bool)((byte)(uVar87 >> 2) & 1);
    auVar119._8_4_ = (uint)bVar82 * auVar96._8_4_ | (uint)!bVar82 * 0x7f800000;
    bVar82 = (bool)((byte)(uVar87 >> 3) & 1);
    auVar119._12_4_ = (uint)bVar82 * auVar96._12_4_ | (uint)!bVar82 * 0x7f800000;
    bVar82 = (bool)((byte)(uVar87 >> 4) & 1);
    auVar119._16_4_ = (uint)bVar82 * auVar96._16_4_ | (uint)!bVar82 * 0x7f800000;
    bVar82 = (bool)((byte)(uVar87 >> 5) & 1);
    auVar119._20_4_ = (uint)bVar82 * auVar96._20_4_ | (uint)!bVar82 * 0x7f800000;
    bVar82 = (bool)((byte)(uVar87 >> 6) & 1);
    auVar119._24_4_ = (uint)bVar82 * auVar96._24_4_ | (uint)!bVar82 * 0x7f800000;
    bVar82 = SUB81(uVar87 >> 7,0);
    auVar119._28_4_ = (uint)bVar82 * auVar96._28_4_ | (uint)!bVar82 * 0x7f800000;
    auVar96 = vminps_avx512vl(auVar116,auVar119);
    auVar97 = vmaxps_avx512vl(auVar116,auVar119);
    auVar112 = vminps_avx512vl(auVar118,auVar96);
    uVar87 = vcmpps_avx512vl(auVar112,auVar96,0);
    uVar86 = vcmpps_avx512vl(auVar97,auVar150,0);
    bVar82 = (bool)((byte)uVar86 & 1);
    bVar26 = (bool)((byte)(uVar86 >> 1) & 1);
    bVar28 = (bool)((byte)(uVar86 >> 2) & 1);
    bVar30 = (bool)((byte)(uVar86 >> 3) & 1);
    bVar32 = (bool)((byte)(uVar86 >> 4) & 1);
    bVar39 = (bool)((byte)(uVar86 >> 5) & 1);
    bVar46 = (bool)((byte)(uVar86 >> 6) & 1);
    bVar53 = SUB81(uVar86 >> 7,0);
    uVar86 = vcmpps_avx512vl(auVar96,auVar150,0);
    bVar24 = (bool)((byte)uVar86 & 1);
    bVar27 = (bool)((byte)(uVar86 >> 1) & 1);
    bVar29 = (bool)((byte)(uVar86 >> 2) & 1);
    bVar31 = (bool)((byte)(uVar86 >> 3) & 1);
    bVar33 = (bool)((byte)(uVar86 >> 4) & 1);
    bVar40 = (bool)((byte)(uVar86 >> 5) & 1);
    bVar47 = (bool)((byte)(uVar86 >> 6) & 1);
    bVar54 = SUB81(uVar86 >> 7,0);
    bVar25 = (bool)((byte)uVar87 & 1);
    auVar120._0_4_ =
         (uint)bVar25 * ((uint)bVar82 * -0x800000 | (uint)!bVar82 * auVar97._0_4_) |
         (uint)!bVar25 * ((uint)bVar24 * -0x800000 | (uint)!bVar24 * auVar96._0_4_);
    bVar82 = (bool)((byte)(uVar87 >> 1) & 1);
    auVar120._4_4_ =
         (uint)bVar82 * ((uint)bVar26 * -0x800000 | (uint)!bVar26 * auVar97._4_4_) |
         (uint)!bVar82 * ((uint)bVar27 * -0x800000 | (uint)!bVar27 * auVar96._4_4_);
    bVar82 = (bool)((byte)(uVar87 >> 2) & 1);
    auVar120._8_4_ =
         (uint)bVar82 * ((uint)bVar28 * -0x800000 | (uint)!bVar28 * auVar97._8_4_) |
         (uint)!bVar82 * ((uint)bVar29 * -0x800000 | (uint)!bVar29 * auVar96._8_4_);
    bVar82 = (bool)((byte)(uVar87 >> 3) & 1);
    auVar120._12_4_ =
         (uint)bVar82 * ((uint)bVar30 * -0x800000 | (uint)!bVar30 * auVar97._12_4_) |
         (uint)!bVar82 * ((uint)bVar31 * -0x800000 | (uint)!bVar31 * auVar96._12_4_);
    bVar82 = (bool)((byte)(uVar87 >> 4) & 1);
    auVar120._16_4_ =
         (uint)bVar82 * ((uint)bVar32 * -0x800000 | (uint)!bVar32 * auVar97._16_4_) |
         (uint)!bVar82 * ((uint)bVar33 * -0x800000 | (uint)!bVar33 * auVar96._16_4_);
    bVar82 = (bool)((byte)(uVar87 >> 5) & 1);
    auVar120._20_4_ =
         (uint)bVar82 * ((uint)bVar39 * -0x800000 | (uint)!bVar39 * auVar97._20_4_) |
         (uint)!bVar82 * ((uint)bVar40 * -0x800000 | (uint)!bVar40 * auVar96._20_4_);
    bVar82 = (bool)((byte)(uVar87 >> 6) & 1);
    auVar120._24_4_ =
         (uint)bVar82 * ((uint)bVar46 * -0x800000 | (uint)!bVar46 * auVar97._24_4_) |
         (uint)!bVar82 * ((uint)bVar47 * -0x800000 | (uint)!bVar47 * auVar96._24_4_);
    bVar82 = SUB81(uVar87 >> 7,0);
    auVar120._28_4_ =
         (uint)bVar82 * ((uint)bVar53 * -0x800000 | (uint)!bVar53 * auVar97._28_4_) |
         (uint)!bVar82 * ((uint)bVar54 * -0x800000 | (uint)!bVar54 * auVar96._28_4_);
    auVar139._0_4_ = auVar129._0_4_ + auVar112._0_4_;
    auVar139._4_4_ = auVar129._4_4_ + auVar112._4_4_;
    auVar139._8_4_ = auVar129._8_4_ + auVar112._8_4_;
    auVar139._12_4_ = auVar129._12_4_ + auVar112._12_4_;
    auVar139._16_4_ = auVar129._16_4_ + auVar112._16_4_;
    auVar139._20_4_ = auVar129._20_4_ + auVar112._20_4_;
    auVar139._24_4_ = auVar129._24_4_ + auVar112._24_4_;
    auVar139._28_4_ = auVar112._28_4_ + 0.0;
    uVar87 = vcmpps_avx512vl(auVar142,auVar139,2);
    uVar11 = *(undefined4 *)(ray + k * 4 + 0x80);
    local_4c0._4_4_ = uVar11;
    local_4c0._0_4_ = uVar11;
    local_4c0._8_4_ = uVar11;
    local_4c0._12_4_ = uVar11;
    local_4c0._16_4_ = uVar11;
    local_4c0._20_4_ = uVar11;
    local_4c0._24_4_ = uVar11;
    local_4c0._28_4_ = uVar11;
    uVar86 = vcmpps_avx512vl(auVar139,local_4c0,2);
    bVar75 = (byte)uVar72 & (byte)uVar73 & bVar85;
    auVar96 = vblendmps_avx512vl(auVar145,auVar115);
    auVar121._0_4_ = (uint)(bVar75 & 1) * auVar96._0_4_ | !(bool)(bVar75 & 1) * auVar114._0_4_;
    bVar82 = (bool)(bVar75 >> 1 & 1);
    auVar121._4_4_ = (uint)bVar82 * auVar96._4_4_ | !bVar82 * auVar114._4_4_;
    bVar82 = (bool)(bVar75 >> 2 & 1);
    auVar121._8_4_ = (uint)bVar82 * auVar96._8_4_ | !bVar82 * auVar114._8_4_;
    bVar82 = (bool)(bVar75 >> 3 & 1);
    auVar121._12_4_ = (uint)bVar82 * auVar96._12_4_ | !bVar82 * auVar114._12_4_;
    bVar82 = (bool)(bVar75 >> 4 & 1);
    auVar121._16_4_ = (uint)bVar82 * auVar96._16_4_ | !bVar82 * auVar114._16_4_;
    bVar82 = (bool)(bVar75 >> 5 & 1);
    auVar121._20_4_ = (uint)bVar82 * auVar96._20_4_ | !bVar82 * auVar114._20_4_;
    bVar82 = (bool)(bVar75 >> 6 & 1);
    auVar121._24_4_ = (uint)bVar82 * auVar96._24_4_ | !bVar82 * auVar114._24_4_;
    auVar121._28_4_ = (uint)(bVar75 >> 7) * auVar96._28_4_ | !(bool)(bVar75 >> 7) * auVar114._28_4_;
    auVar158 = ZEXT3264(auVar121);
    auVar96 = vmaxps_avx512vl(auVar121,auVar120);
    auVar154 = ZEXT3264(auVar96);
    uVar88 = vcmpps_avx512vl(auVar112,auVar150,4);
    uVar88 = uVar87 & uVar86 & uVar88;
    auVar151._0_4_ = auVar96._0_4_ + auVar129._0_4_;
    auVar151._4_4_ = auVar96._4_4_ + auVar129._4_4_;
    auVar151._8_4_ = auVar96._8_4_ + auVar129._8_4_;
    auVar151._12_4_ = auVar96._12_4_ + auVar129._12_4_;
    auVar151._16_4_ = auVar96._16_4_ + auVar129._16_4_;
    auVar151._20_4_ = auVar96._20_4_ + auVar129._20_4_;
    auVar151._24_4_ = auVar96._24_4_ + auVar129._24_4_;
    auVar151._28_4_ = auVar96._28_4_ + 0.0;
    auVar152 = ZEXT3264(auVar151);
    uVar70 = vcmpps_avx512vl(auVar142,auVar151,2);
    uVar71 = vcmpps_avx512vl(auVar151,local_4c0,2);
    uVar72 = vcmpps_avx512vl(auVar96,auVar145,4);
    bVar84 = (byte)uVar70 & (byte)uVar71 & (byte)uVar72;
    bVar75 = (byte)uVar88 & bVar85;
    bVar76 = bVar84 & bVar85;
    if (bVar75 != 0 || bVar76 != 0) {
      auVar96 = vblendmps_avx512vl(auVar96,auVar112);
      auVar122._0_4_ =
           (float)((uint)(bVar75 & 1) * auVar96._0_4_ |
                  (uint)!(bool)(bVar75 & 1) * (int)auVar112._0_4_);
      bVar82 = (bool)(bVar75 >> 1 & 1);
      auVar122._4_4_ = (float)((uint)bVar82 * auVar96._4_4_ | (uint)!bVar82 * (int)auVar112._4_4_);
      bVar82 = (bool)(bVar75 >> 2 & 1);
      auVar122._8_4_ = (float)((uint)bVar82 * auVar96._8_4_ | (uint)!bVar82 * (int)auVar112._8_4_);
      bVar82 = (bool)(bVar75 >> 3 & 1);
      auVar122._12_4_ =
           (float)((uint)bVar82 * auVar96._12_4_ | (uint)!bVar82 * (int)auVar112._12_4_);
      bVar82 = (bool)(bVar75 >> 4 & 1);
      auVar122._16_4_ =
           (float)((uint)bVar82 * auVar96._16_4_ | (uint)!bVar82 * (int)auVar112._16_4_);
      bVar82 = (bool)(bVar75 >> 5 & 1);
      auVar122._20_4_ =
           (float)((uint)bVar82 * auVar96._20_4_ | (uint)!bVar82 * (int)auVar112._20_4_);
      bVar82 = (bool)(bVar75 >> 6 & 1);
      auVar122._24_4_ =
           (float)((uint)bVar82 * auVar96._24_4_ | (uint)!bVar82 * (int)auVar112._24_4_);
      auVar122._28_4_ =
           (float)((uint)(bVar75 >> 7) * auVar96._28_4_ |
                  (uint)!(bool)(bVar75 >> 7) * (int)auVar112._28_4_);
      uVar70 = vcmpps_avx512vl(auVar122,auVar118,0);
      uVar71 = vcmpps_avx512vl(auVar122,auVar121,0);
      auVar96 = vblendmps_avx512vl(auVar106,auVar147);
      auVar123._0_4_ =
           (float)((uint)(bVar75 & 1) * auVar96._0_4_ | !(bool)(bVar75 & 1) * auVar120._0_4_);
      bVar82 = (bool)(bVar75 >> 1 & 1);
      auVar123._4_4_ = (float)((uint)bVar82 * auVar96._4_4_ | !bVar82 * auVar120._4_4_);
      bVar82 = (bool)(bVar75 >> 2 & 1);
      auVar123._8_4_ = (float)((uint)bVar82 * auVar96._8_4_ | !bVar82 * auVar120._8_4_);
      bVar82 = (bool)(bVar75 >> 3 & 1);
      auVar123._12_4_ = (float)((uint)bVar82 * auVar96._12_4_ | !bVar82 * auVar120._12_4_);
      bVar82 = (bool)(bVar75 >> 4 & 1);
      auVar123._16_4_ = (float)((uint)bVar82 * auVar96._16_4_ | !bVar82 * auVar120._16_4_);
      bVar82 = (bool)(bVar75 >> 5 & 1);
      auVar123._20_4_ = (float)((uint)bVar82 * auVar96._20_4_ | !bVar82 * auVar120._20_4_);
      bVar82 = (bool)(bVar75 >> 6 & 1);
      auVar123._24_4_ = (float)((uint)bVar82 * auVar96._24_4_ | !bVar82 * auVar120._24_4_);
      auVar123._28_4_ =
           (uint)(bVar75 >> 7) * auVar96._28_4_ | !(bool)(bVar75 >> 7) * auVar120._28_4_;
      auVar81._4_4_ = auVar124._4_4_ * fVar58 * auVar102._4_4_;
      auVar81._0_4_ = auVar124._0_4_ * fVar9 * auVar102._0_4_;
      auVar81._8_4_ = auVar124._8_4_ * fVar60 * auVar102._8_4_;
      auVar81._12_4_ = auVar124._12_4_ * fVar62 * auVar102._12_4_;
      auVar81._16_4_ = auVar124._16_4_ * fVar64 * auVar102._16_4_;
      auVar81._20_4_ = auVar124._20_4_ * fVar66 * auVar102._20_4_;
      auVar81._24_4_ = auVar124._24_4_ * fVar68 * auVar102._24_4_;
      auVar81._28_4_ = auVar124._28_4_;
      auVar96 = vmulps_avx512vl(auVar98,auVar81);
      auVar146 = ZEXT3264(auVar96);
      auVar97 = vmulps_avx512vl(auVar99,auVar81);
      auVar148 = ZEXT3264(auVar97);
      auVar124 = vmulps_avx512vl(auVar100,auVar81);
      auVar160 = ZEXT3264(auVar124);
      local_80 = vmulps_avx512vl(auVar98,auVar132);
      local_a0 = vmulps_avx512vl(auVar99,auVar132);
      auVar106 = vmulps_avx512vl(auVar100,auVar132);
      bVar77 = ((byte)uVar70 | (byte)uVar71) & bVar85;
      uVar87 = vcmpps_avx512vl(auVar122,auVar116,0);
      uVar87 = uVar74 & uVar83 & uVar87;
      auVar112 = vmulps_avx512vl(auVar93,auVar122);
      auVar117 = vmulps_avx512vl(auVar94,auVar122);
      auVar113 = vmulps_avx512vl(auVar95,auVar122);
      auVar125._0_4_ = auVar112._0_4_ + (float)local_480._0_4_;
      auVar125._4_4_ = auVar112._4_4_ + (float)local_480._4_4_;
      auVar125._8_4_ = auVar112._8_4_ + fStack_478;
      auVar125._12_4_ = auVar112._12_4_ + fStack_474;
      auVar125._16_4_ = auVar112._16_4_ + fStack_470;
      auVar125._20_4_ = auVar112._20_4_ + fStack_46c;
      auVar125._24_4_ = auVar112._24_4_ + fStack_468;
      auVar125._28_4_ = auVar112._28_4_ + fStack_464;
      auVar101 = vaddps_avx512vl(auVar101,auVar117);
      auVar134._0_4_ = auVar113._0_4_ + (float)local_4a0._0_4_;
      auVar134._4_4_ = auVar113._4_4_ + (float)local_4a0._4_4_;
      auVar134._8_4_ = auVar113._8_4_ + fStack_498;
      auVar134._12_4_ = auVar113._12_4_ + fStack_494;
      auVar134._16_4_ = auVar113._16_4_ + fStack_490;
      auVar134._20_4_ = auVar113._20_4_ + fStack_48c;
      auVar134._24_4_ = auVar113._24_4_ + fStack_488;
      auVar134._28_4_ = auVar113._28_4_ + local_4a0._28_4_;
      auVar112 = vmulps_avx512vl(auVar108,auVar125);
      auVar101 = vmulps_avx512vl(auVar108,auVar101);
      auVar117 = vmulps_avx512vl(auVar108,auVar134);
      auVar108._0_4_ = auVar96._0_4_ + auVar112._0_4_;
      auVar108._4_4_ = auVar96._4_4_ + auVar112._4_4_;
      auVar108._8_4_ = auVar96._8_4_ + auVar112._8_4_;
      auVar108._12_4_ = auVar96._12_4_ + auVar112._12_4_;
      auVar108._16_4_ = auVar96._16_4_ + auVar112._16_4_;
      auVar108._20_4_ = auVar96._20_4_ + auVar112._20_4_;
      auVar108._24_4_ = auVar96._24_4_ + auVar112._24_4_;
      auVar108._28_4_ = auVar96._28_4_ + auVar112._28_4_;
      auVar133._0_4_ = auVar97._0_4_ + auVar101._0_4_;
      auVar133._4_4_ = auVar97._4_4_ + auVar101._4_4_;
      auVar133._8_4_ = auVar97._8_4_ + auVar101._8_4_;
      auVar133._12_4_ = auVar97._12_4_ + auVar101._12_4_;
      auVar133._16_4_ = auVar97._16_4_ + auVar101._16_4_;
      auVar133._20_4_ = auVar97._20_4_ + auVar101._20_4_;
      auVar133._24_4_ = auVar97._24_4_ + auVar101._24_4_;
      auVar133._28_4_ = auVar97._28_4_ + auVar101._28_4_;
      auVar96 = vaddps_avx512vl(auVar124,auVar117);
      auVar93._4_4_ = local_80._4_4_ * auVar123._4_4_;
      auVar93._0_4_ = local_80._0_4_ * auVar123._0_4_;
      auVar93._8_4_ = local_80._8_4_ * auVar123._8_4_;
      auVar93._12_4_ = local_80._12_4_ * auVar123._12_4_;
      auVar93._16_4_ = local_80._16_4_ * auVar123._16_4_;
      auVar93._20_4_ = local_80._20_4_ * auVar123._20_4_;
      auVar93._24_4_ = local_80._24_4_ * auVar123._24_4_;
      auVar93._28_4_ = local_80._28_4_;
      auVar94._4_4_ = local_a0._4_4_ * auVar123._4_4_;
      auVar94._0_4_ = local_a0._0_4_ * auVar123._0_4_;
      auVar94._8_4_ = local_a0._8_4_ * auVar123._8_4_;
      auVar94._12_4_ = local_a0._12_4_ * auVar123._12_4_;
      auVar94._16_4_ = local_a0._16_4_ * auVar123._16_4_;
      auVar94._20_4_ = local_a0._20_4_ * auVar123._20_4_;
      auVar94._24_4_ = local_a0._24_4_ * auVar123._24_4_;
      auVar94._28_4_ = local_a0._28_4_;
      local_c0 = vxorps_avx512vl(auVar98,auVar135);
      auVar97 = vblendmps_avx512vl(auVar98,local_c0);
      bVar75 = (byte)uVar87;
      bVar82 = (bool)((byte)(uVar87 >> 1) & 1);
      bVar25 = (bool)((byte)(uVar87 >> 2) & 1);
      bVar26 = (bool)((byte)(uVar87 >> 3) & 1);
      bVar27 = (bool)((byte)(uVar87 >> 4) & 1);
      bVar28 = (bool)((byte)(uVar87 >> 5) & 1);
      bVar29 = (bool)((byte)(uVar87 >> 6) & 1);
      bVar30 = SUB81(uVar87 >> 7,0);
      auVar98 = vsubps_avx512vl(auVar108,auVar93);
      local_400._0_4_ =
           (uint)(bVar77 & 1) * auVar98._0_4_ |
           (uint)!(bool)(bVar77 & 1) *
           ((uint)(bVar75 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar75 & 1) * local_c0._0_4_);
      bVar24 = (bool)(bVar77 >> 1 & 1);
      local_400._4_4_ =
           (uint)bVar24 * auVar98._4_4_ |
           (uint)!bVar24 * ((uint)bVar82 * auVar97._4_4_ | (uint)!bVar82 * local_c0._4_4_);
      bVar82 = (bool)(bVar77 >> 2 & 1);
      local_400._8_4_ =
           (uint)bVar82 * auVar98._8_4_ |
           (uint)!bVar82 * ((uint)bVar25 * auVar97._8_4_ | (uint)!bVar25 * local_c0._8_4_);
      bVar82 = (bool)(bVar77 >> 3 & 1);
      local_400._12_4_ =
           (uint)bVar82 * auVar98._12_4_ |
           (uint)!bVar82 * ((uint)bVar26 * auVar97._12_4_ | (uint)!bVar26 * local_c0._12_4_);
      bVar82 = (bool)(bVar77 >> 4 & 1);
      local_400._16_4_ =
           (uint)bVar82 * auVar98._16_4_ |
           (uint)!bVar82 * ((uint)bVar27 * auVar97._16_4_ | (uint)!bVar27 * local_c0._16_4_);
      bVar82 = (bool)(bVar77 >> 5 & 1);
      local_400._20_4_ =
           (uint)bVar82 * auVar98._20_4_ |
           (uint)!bVar82 * ((uint)bVar28 * auVar97._20_4_ | (uint)!bVar28 * local_c0._20_4_);
      bVar82 = (bool)(bVar77 >> 6 & 1);
      local_400._24_4_ =
           (uint)bVar82 * auVar98._24_4_ |
           (uint)!bVar82 * ((uint)bVar29 * auVar97._24_4_ | (uint)!bVar29 * local_c0._24_4_);
      local_400._28_4_ =
           (uint)(bVar77 >> 7) * auVar98._28_4_ |
           (uint)!(bool)(bVar77 >> 7) *
           ((uint)bVar30 * auVar97._28_4_ | (uint)!bVar30 * local_c0._28_4_);
      auVar140 = ZEXT3264(auVar106);
      auVar97 = vxorps_avx512vl(auVar99,auVar135);
      auVar155 = ZEXT3264(auVar97);
      auVar97 = vblendmps_avx512vl(auVar99,auVar97);
      bVar82 = (bool)((byte)(uVar87 >> 1) & 1);
      bVar25 = (bool)((byte)(uVar87 >> 2) & 1);
      bVar26 = (bool)((byte)(uVar87 >> 3) & 1);
      bVar27 = (bool)((byte)(uVar87 >> 4) & 1);
      bVar28 = (bool)((byte)(uVar87 >> 5) & 1);
      bVar29 = (bool)((byte)(uVar87 >> 6) & 1);
      bVar30 = SUB81(uVar87 >> 7,0);
      auVar98 = vsubps_avx512vl(auVar133,auVar94);
      local_3e0._0_4_ =
           (uint)(bVar77 & 1) * auVar98._0_4_ |
           (uint)!(bool)(bVar77 & 1) *
           ((uint)(bVar75 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar75 & 1) * (int)auVar108._0_4_);
      bVar24 = (bool)(bVar77 >> 1 & 1);
      local_3e0._4_4_ =
           (uint)bVar24 * auVar98._4_4_ |
           (uint)!bVar24 * ((uint)bVar82 * auVar97._4_4_ | (uint)!bVar82 * (int)auVar108._4_4_);
      bVar82 = (bool)(bVar77 >> 2 & 1);
      local_3e0._8_4_ =
           (uint)bVar82 * auVar98._8_4_ |
           (uint)!bVar82 * ((uint)bVar25 * auVar97._8_4_ | (uint)!bVar25 * (int)auVar108._8_4_);
      bVar82 = (bool)(bVar77 >> 3 & 1);
      local_3e0._12_4_ =
           (uint)bVar82 * auVar98._12_4_ |
           (uint)!bVar82 * ((uint)bVar26 * auVar97._12_4_ | (uint)!bVar26 * (int)auVar108._12_4_);
      bVar82 = (bool)(bVar77 >> 4 & 1);
      local_3e0._16_4_ =
           (uint)bVar82 * auVar98._16_4_ |
           (uint)!bVar82 * ((uint)bVar27 * auVar97._16_4_ | (uint)!bVar27 * (int)auVar108._16_4_);
      bVar82 = (bool)(bVar77 >> 5 & 1);
      local_3e0._20_4_ =
           (uint)bVar82 * auVar98._20_4_ |
           (uint)!bVar82 * ((uint)bVar28 * auVar97._20_4_ | (uint)!bVar28 * (int)auVar108._20_4_);
      bVar82 = (bool)(bVar77 >> 6 & 1);
      local_3e0._24_4_ =
           (uint)bVar82 * auVar98._24_4_ |
           (uint)!bVar82 * ((uint)bVar29 * auVar97._24_4_ | (uint)!bVar29 * (int)auVar108._24_4_);
      local_3e0._28_4_ =
           (uint)(bVar77 >> 7) * auVar98._28_4_ |
           (uint)!(bool)(bVar77 >> 7) *
           ((uint)bVar30 * auVar97._28_4_ | (uint)!bVar30 * (int)auVar108._28_4_);
      auVar95._4_4_ = auVar106._4_4_ * auVar123._4_4_;
      auVar95._0_4_ = auVar106._0_4_ * auVar123._0_4_;
      auVar95._8_4_ = auVar106._8_4_ * auVar123._8_4_;
      auVar95._12_4_ = auVar106._12_4_ * auVar123._12_4_;
      auVar95._16_4_ = auVar106._16_4_ * auVar123._16_4_;
      auVar95._20_4_ = auVar106._20_4_ * auVar123._20_4_;
      auVar95._24_4_ = auVar106._24_4_ * auVar123._24_4_;
      auVar95._28_4_ = auVar133._28_4_;
      local_e0 = vxorps_avx512vl(auVar100,auVar135);
      auVar97 = vblendmps_avx512vl(auVar100,local_e0);
      bVar82 = (bool)((byte)(uVar87 >> 1) & 1);
      bVar25 = (bool)((byte)(uVar87 >> 2) & 1);
      bVar26 = (bool)((byte)(uVar87 >> 3) & 1);
      bVar27 = (bool)((byte)(uVar87 >> 4) & 1);
      bVar28 = (bool)((byte)(uVar87 >> 5) & 1);
      bVar29 = (bool)((byte)(uVar87 >> 6) & 1);
      bVar30 = SUB81(uVar87 >> 7,0);
      auVar96 = vsubps_avx512vl(auVar96,auVar95);
      local_3c0._0_4_ =
           (uint)(bVar77 & 1) * auVar96._0_4_ |
           (uint)!(bool)(bVar77 & 1) *
           ((uint)(bVar75 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar75 & 1) * local_e0._0_4_);
      bVar24 = (bool)(bVar77 >> 1 & 1);
      local_3c0._4_4_ =
           (uint)bVar24 * auVar96._4_4_ |
           (uint)!bVar24 * ((uint)bVar82 * auVar97._4_4_ | (uint)!bVar82 * local_e0._4_4_);
      bVar82 = (bool)(bVar77 >> 2 & 1);
      local_3c0._8_4_ =
           (uint)bVar82 * auVar96._8_4_ |
           (uint)!bVar82 * ((uint)bVar25 * auVar97._8_4_ | (uint)!bVar25 * local_e0._8_4_);
      bVar82 = (bool)(bVar77 >> 3 & 1);
      local_3c0._12_4_ =
           (uint)bVar82 * auVar96._12_4_ |
           (uint)!bVar82 * ((uint)bVar26 * auVar97._12_4_ | (uint)!bVar26 * local_e0._12_4_);
      bVar82 = (bool)(bVar77 >> 4 & 1);
      local_3c0._16_4_ =
           (uint)bVar82 * auVar96._16_4_ |
           (uint)!bVar82 * ((uint)bVar27 * auVar97._16_4_ | (uint)!bVar27 * local_e0._16_4_);
      bVar82 = (bool)(bVar77 >> 5 & 1);
      local_3c0._20_4_ =
           (uint)bVar82 * auVar96._20_4_ |
           (uint)!bVar82 * ((uint)bVar28 * auVar97._20_4_ | (uint)!bVar28 * local_e0._20_4_);
      bVar82 = (bool)(bVar77 >> 6 & 1);
      local_3c0._24_4_ =
           (uint)bVar82 * auVar96._24_4_ |
           (uint)!bVar82 * ((uint)bVar29 * auVar97._24_4_ | (uint)!bVar29 * local_e0._24_4_);
      local_3c0._28_4_ =
           (uint)(bVar77 >> 7) * auVar96._28_4_ |
           (uint)!(bool)(bVar77 >> 7) *
           ((uint)bVar30 * auVar97._28_4_ | (uint)!bVar30 * local_e0._28_4_);
      auVar96 = vrcp14ps_avx512vl(auVar102);
      auVar97 = vfnmadd213ps_avx512vl(auVar96,auVar102,auVar136);
      auVar89 = vfmadd132ps_fma(auVar97,auVar96,auVar96);
      auVar143 = ZEXT1664(auVar89);
      iVar1 = (uint)!(bool)(bVar75 & 1) * 0x3f800000;
      iVar2 = (uint)!(bool)((byte)(uVar87 >> 1) & 1) * 0x3f800000;
      iVar3 = (uint)!(bool)((byte)(uVar87 >> 2) & 1) * 0x3f800000;
      iVar4 = (uint)!(bool)((byte)(uVar87 >> 3) & 1) * 0x3f800000;
      iVar5 = (uint)!(bool)((byte)(uVar87 >> 4) & 1) * 0x3f800000;
      iVar6 = (uint)!(bool)((byte)(uVar87 >> 5) & 1) * 0x3f800000;
      iVar7 = (uint)!(bool)((byte)(uVar87 >> 6) & 1) * 0x3f800000;
      iVar8 = (uint)!SUB81(uVar87 >> 7,0) * 0x3f800000;
      auVar161 = ZEXT3264(CONCAT428(iVar8,CONCAT424(iVar7,CONCAT420(iVar6,CONCAT416(iVar5,CONCAT412(
                                                  iVar4,CONCAT48(iVar3,CONCAT44(iVar2,iVar1))))))));
      auVar96 = vmulps_avx512vl(auVar123,ZEXT1632(auVar89));
      local_460._0_4_ = (uint)(bVar77 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar77 & 1) * iVar1;
      bVar82 = (bool)(bVar77 >> 1 & 1);
      local_460._4_4_ = (uint)bVar82 * auVar96._4_4_ | (uint)!bVar82 * iVar2;
      bVar82 = (bool)(bVar77 >> 2 & 1);
      local_460._8_4_ = (uint)bVar82 * auVar96._8_4_ | (uint)!bVar82 * iVar3;
      bVar82 = (bool)(bVar77 >> 3 & 1);
      local_460._12_4_ = (uint)bVar82 * auVar96._12_4_ | (uint)!bVar82 * iVar4;
      bVar82 = (bool)(bVar77 >> 4 & 1);
      local_460._16_4_ = (uint)bVar82 * auVar96._16_4_ | (uint)!bVar82 * iVar5;
      bVar82 = (bool)(bVar77 >> 5 & 1);
      local_460._20_4_ = (uint)bVar82 * auVar96._20_4_ | (uint)!bVar82 * iVar6;
      bVar82 = (bool)(bVar77 >> 6 & 1);
      local_460._24_4_ = (uint)bVar82 * auVar96._24_4_ | (uint)!bVar82 * iVar7;
      local_460._28_4_ = (uint)(bVar77 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar77 >> 7) * iVar8;
      local_420._0_4_ = auVar129._0_4_ + auVar122._0_4_;
      local_420._4_4_ = auVar129._4_4_ + auVar122._4_4_;
      local_420._8_4_ = auVar129._8_4_ + auVar122._8_4_;
      local_420._12_4_ = auVar129._12_4_ + auVar122._12_4_;
      local_420._16_4_ = auVar129._16_4_ + auVar122._16_4_;
      local_420._20_4_ = auVar129._20_4_ + auVar122._20_4_;
      local_420._24_4_ = auVar129._24_4_ + auVar122._24_4_;
      local_420._28_4_ = auVar122._28_4_ + 0.0;
      local_440 = ZEXT1232(ZEXT812(0)) << 0x20;
      uVar83 = (ulong)(bVar85 & ((byte)uVar88 | bVar84));
      auVar89 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
      auVar138 = ZEXT1664(auVar89);
      auVar96 = vpcmpeqd_avx2(local_400,local_400);
      auVar144 = ZEXT3264(auVar96);
      local_598 = ray;
      do {
        bVar85 = (byte)uVar88;
        local_590.valid = (int *)local_5b0;
        auVar94 = auVar161._0_32_;
        auVar97 = auVar143._0_32_;
        auVar105 = auVar167._0_32_;
        auVar104 = auVar166._0_32_;
        auVar102 = auVar155._0_32_;
        auVar103 = auVar165._0_32_;
        auVar96 = auVar140._0_32_;
        auVar92 = auVar159._0_32_;
        auVar93 = auVar160._0_32_;
        auVar101 = auVar148._0_32_;
        auVar98 = auVar146._0_32_;
        auVar108 = auVar169._0_32_;
        auVar107 = auVar168._0_32_;
        auVar100 = auVar164._0_32_;
        auVar99 = auVar163._0_32_;
        auVar112 = auVar156._0_32_;
        auVar113 = auVar158._0_32_;
        auVar117 = auVar157._0_32_;
        auVar106 = auVar154._0_32_;
        auVar124 = auVar152._0_32_;
        auVar95 = auVar162._0_32_;
        uVar74 = 0;
        for (uVar87 = uVar83; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000) {
          uVar74 = uVar74 + 1;
        }
        pGVar21 = (pSVar20->geometries).items[*(uint *)(local_100 + uVar74 * 4)].ptr;
        if ((pGVar21->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar82 = true, pGVar21->occlusionFilterN == (RTCFilterFunctionN)0x0))
          goto LAB_01982ddb;
          uVar87 = (ulong)(uint)((int)uVar74 * 4);
          uVar11 = *(undefined4 *)(local_460 + uVar87);
          local_520._4_4_ = uVar11;
          local_520._0_4_ = uVar11;
          local_520._8_4_ = uVar11;
          local_520._12_4_ = uVar11;
          uVar11 = *(undefined4 *)(local_440 + uVar87);
          local_510._4_4_ = uVar11;
          local_510._0_4_ = uVar11;
          local_510._8_4_ = uVar11;
          local_510._12_4_ = uVar11;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_420 + uVar87);
          local_590.context = context->user;
          local_4f0 = vpbroadcastd_avx512vl();
          uVar11 = *(undefined4 *)((long)&(line->primIDs).field_0 + uVar87);
          local_500._4_4_ = uVar11;
          local_500._0_4_ = uVar11;
          local_500._8_4_ = uVar11;
          local_500._12_4_ = uVar11;
          uVar11 = *(undefined4 *)(local_400 + uVar87);
          local_550._4_4_ = uVar11;
          local_550._0_4_ = uVar11;
          local_550._8_4_ = uVar11;
          local_550._12_4_ = uVar11;
          uVar11 = *(undefined4 *)(local_3e0 + uVar87);
          local_540._4_4_ = uVar11;
          local_540._0_4_ = uVar11;
          local_540._8_4_ = uVar11;
          local_540._12_4_ = uVar11;
          uVar11 = *(undefined4 *)(local_3c0 + uVar87);
          local_530._4_4_ = uVar11;
          local_530._0_4_ = uVar11;
          local_530._8_4_ = uVar11;
          local_530._12_4_ = uVar11;
          uStack_4dc = (local_590.context)->instID[0];
          local_4e0 = uStack_4dc;
          uStack_4d8 = uStack_4dc;
          uStack_4d4 = uStack_4dc;
          uStack_4d0 = (local_590.context)->instPrimID[0];
          uStack_4cc = uStack_4d0;
          uStack_4c8 = uStack_4d0;
          uStack_4c4 = uStack_4d0;
          local_5b0 = auVar138._0_16_;
          local_590.geometryUserPtr = pGVar21->userPtr;
          local_590.hit = local_550;
          local_590.N = 4;
          local_120 = auVar95;
          local_140 = auVar99;
          local_160 = auVar100;
          local_180 = auVar103;
          local_1a0 = auVar104;
          local_1c0 = auVar105;
          local_1e0 = auVar107;
          local_200 = auVar108;
          local_220 = auVar94;
          local_240 = auVar92;
          local_260 = auVar112;
          local_280 = auVar124;
          local_2a0 = auVar117;
          local_2c0 = auVar106;
          local_2e0 = auVar113;
          local_300 = auVar98;
          local_320 = auVar101;
          local_340 = auVar93;
          local_360 = auVar96;
          local_380 = auVar97;
          local_3a0 = auVar102;
          uVar87 = uVar88;
          local_590.ray = (RTCRayN *)ray;
          local_560 = local_5b0;
          if (pGVar21->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar96 = ZEXT1632(auVar144._0_16_);
            (*pGVar21->occlusionFilterN)(&local_590);
            auVar96 = vpcmpeqd_avx2(auVar96,auVar96);
            auVar144 = ZEXT3264(auVar96);
            auVar155 = ZEXT3264(local_3a0);
            auVar143 = ZEXT3264(local_380);
            auVar140 = ZEXT3264(local_360);
            auVar160 = ZEXT3264(local_340);
            auVar148 = ZEXT3264(local_320);
            auVar146 = ZEXT3264(local_300);
            uVar87 = uVar88 & 0xffff;
            auVar158 = ZEXT3264(local_2e0);
            auVar154 = ZEXT3264(local_2c0);
            auVar157 = ZEXT3264(local_2a0);
            auVar152 = ZEXT3264(local_280);
            auVar156 = ZEXT3264(local_260);
            auVar138 = ZEXT1664(local_560);
            auVar159 = ZEXT3264(local_240);
            auVar161 = ZEXT3264(local_220);
            auVar169 = ZEXT3264(local_200);
            auVar168 = ZEXT3264(local_1e0);
            auVar167 = ZEXT3264(local_1c0);
            auVar166 = ZEXT3264(local_1a0);
            auVar165 = ZEXT3264(local_180);
            auVar164 = ZEXT3264(local_160);
            auVar163 = ZEXT3264(local_140);
            auVar162 = ZEXT3264(local_120);
          }
          uVar86 = vptestmd_avx512vl(local_5b0,local_5b0);
          if ((uVar86 & 0xf) != 0) {
            p_Var23 = context->args->filter;
            if ((p_Var23 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar21->field_8).field_0x2 & 0x40) != 0)))) {
              auVar96 = ZEXT1632(auVar144._0_16_);
              (*p_Var23)(&local_590);
              auVar96 = vpcmpeqd_avx2(auVar96,auVar96);
              auVar144 = ZEXT3264(auVar96);
              auVar155 = ZEXT3264(local_3a0);
              auVar143 = ZEXT3264(local_380);
              auVar140 = ZEXT3264(local_360);
              auVar160 = ZEXT3264(local_340);
              auVar148 = ZEXT3264(local_320);
              auVar146 = ZEXT3264(local_300);
              uVar87 = uVar88 & 0xffff;
              auVar158 = ZEXT3264(local_2e0);
              auVar154 = ZEXT3264(local_2c0);
              auVar157 = ZEXT3264(local_2a0);
              auVar152 = ZEXT3264(local_280);
              auVar156 = ZEXT3264(local_260);
              auVar138 = ZEXT1664(local_560);
              auVar159 = ZEXT3264(local_240);
              auVar161 = ZEXT3264(local_220);
              auVar169 = ZEXT3264(local_200);
              auVar168 = ZEXT3264(local_1e0);
              auVar167 = ZEXT3264(local_1c0);
              auVar166 = ZEXT3264(local_1a0);
              auVar165 = ZEXT3264(local_180);
              auVar164 = ZEXT3264(local_160);
              auVar163 = ZEXT3264(local_140);
              auVar162 = ZEXT3264(local_120);
            }
            bVar85 = (byte)uVar87;
            auVar94 = auVar161._0_32_;
            auVar97 = auVar143._0_32_;
            auVar105 = auVar167._0_32_;
            auVar104 = auVar166._0_32_;
            auVar102 = auVar155._0_32_;
            auVar103 = auVar165._0_32_;
            auVar96 = auVar140._0_32_;
            auVar92 = auVar159._0_32_;
            auVar93 = auVar160._0_32_;
            auVar101 = auVar148._0_32_;
            auVar98 = auVar146._0_32_;
            auVar108 = auVar169._0_32_;
            auVar107 = auVar168._0_32_;
            auVar100 = auVar164._0_32_;
            auVar99 = auVar163._0_32_;
            auVar95 = auVar162._0_32_;
            auVar112 = auVar156._0_32_;
            auVar113 = auVar158._0_32_;
            auVar117 = auVar157._0_32_;
            auVar106 = auVar154._0_32_;
            auVar124 = auVar152._0_32_;
            uVar86 = vptestmd_avx512vl(local_5b0,local_5b0);
            uVar86 = uVar86 & 0xf;
            auVar89 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar82 = (bool)((byte)uVar86 & 1);
            auVar90._0_4_ =
                 (uint)bVar82 * auVar89._0_4_ | (uint)!bVar82 * *(int *)(local_590.ray + 0x80);
            bVar82 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar90._4_4_ =
                 (uint)bVar82 * auVar89._4_4_ | (uint)!bVar82 * *(int *)(local_590.ray + 0x84);
            bVar82 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar90._8_4_ =
                 (uint)bVar82 * auVar89._8_4_ | (uint)!bVar82 * *(int *)(local_590.ray + 0x88);
            bVar82 = SUB81(uVar86 >> 3,0);
            auVar90._12_4_ =
                 (uint)bVar82 * auVar89._12_4_ | (uint)!bVar82 * *(int *)(local_590.ray + 0x8c);
            *(undefined1 (*) [16])(local_590.ray + 0x80) = auVar90;
            if ((byte)uVar86 != 0) {
              local_4c0 = ZEXT432(*(uint *)(ray + k * 4 + 0x80));
              bVar82 = true;
              goto LAB_01982ddb;
            }
          }
          *(int *)(ray + k * 4 + 0x80) = local_4c0._0_4_;
          uVar88 = uVar87;
        }
        bVar85 = (byte)uVar88;
        auVar94 = auVar161._0_32_;
        auVar97 = auVar143._0_32_;
        auVar105 = auVar167._0_32_;
        auVar104 = auVar166._0_32_;
        auVar102 = auVar155._0_32_;
        auVar103 = auVar165._0_32_;
        auVar96 = auVar140._0_32_;
        auVar92 = auVar159._0_32_;
        auVar93 = auVar160._0_32_;
        auVar101 = auVar148._0_32_;
        auVar98 = auVar146._0_32_;
        auVar108 = auVar169._0_32_;
        auVar107 = auVar168._0_32_;
        auVar100 = auVar164._0_32_;
        auVar99 = auVar163._0_32_;
        auVar95 = auVar162._0_32_;
        auVar112 = auVar156._0_32_;
        auVar113 = auVar158._0_32_;
        auVar117 = auVar157._0_32_;
        auVar106 = auVar154._0_32_;
        auVar124 = auVar152._0_32_;
        uVar83 = uVar83 ^ 1L << (uVar74 & 0x3f);
      } while (uVar83 != 0);
      bVar82 = false;
LAB_01982ddb:
      auVar126._4_4_ = local_4c0._0_4_;
      auVar126._0_4_ = local_4c0._0_4_;
      auVar126._8_4_ = local_4c0._0_4_;
      auVar126._12_4_ = local_4c0._0_4_;
      auVar126._16_4_ = local_4c0._0_4_;
      auVar126._20_4_ = local_4c0._0_4_;
      auVar126._24_4_ = local_4c0._0_4_;
      auVar126._28_4_ = local_4c0._0_4_;
      uVar70 = vcmpps_avx512vl(auVar124,auVar126,2);
      bVar85 = bVar85 & (byte)uVar70;
      if ((bVar85 & bVar76) == 0) {
        return bVar82;
      }
      uVar70 = vcmpps_avx512vl(auVar106,auVar117,0);
      uVar71 = vcmpps_avx512vl(auVar106,auVar113,0);
      bVar84 = (byte)uVar70 | (byte)uVar71;
      uVar83 = vcmpps_avx512vl(auVar106,auVar112,0);
      auVar112 = vmulps_avx512vl(auVar95,auVar106);
      auVar117 = vmulps_avx512vl(auVar99,auVar106);
      auVar106 = vmulps_avx512vl(auVar100,auVar106);
      auVar127._0_4_ = auVar112._0_4_ + (float)local_480._0_4_;
      auVar127._4_4_ = auVar112._4_4_ + (float)local_480._4_4_;
      auVar127._8_4_ = auVar112._8_4_ + fStack_478;
      auVar127._12_4_ = auVar112._12_4_ + fStack_474;
      auVar127._16_4_ = auVar112._16_4_ + fStack_470;
      auVar127._20_4_ = auVar112._20_4_ + fStack_46c;
      auVar127._24_4_ = auVar112._24_4_ + fStack_468;
      auVar127._28_4_ = auVar112._28_4_ + fStack_464;
      auVar112 = vaddps_avx512vl(auVar107,auVar117);
      auVar131._0_4_ = auVar106._0_4_ + (float)local_4a0._0_4_;
      auVar131._4_4_ = auVar106._4_4_ + (float)local_4a0._4_4_;
      auVar131._8_4_ = auVar106._8_4_ + fStack_498;
      auVar131._12_4_ = auVar106._12_4_ + fStack_494;
      auVar131._16_4_ = auVar106._16_4_ + fStack_490;
      auVar131._20_4_ = auVar106._20_4_ + fStack_48c;
      auVar131._24_4_ = auVar106._24_4_ + fStack_488;
      auVar131._28_4_ = auVar106._28_4_ + fStack_484;
      auVar106 = vmulps_avx512vl(auVar108,auVar127);
      auVar112 = vmulps_avx512vl(auVar108,auVar112);
      auVar117 = vmulps_avx512vl(auVar108,auVar131);
      auVar128._0_4_ = auVar98._0_4_ + auVar106._0_4_;
      auVar128._4_4_ = auVar98._4_4_ + auVar106._4_4_;
      auVar128._8_4_ = auVar98._8_4_ + auVar106._8_4_;
      auVar128._12_4_ = auVar98._12_4_ + auVar106._12_4_;
      auVar128._16_4_ = auVar98._16_4_ + auVar106._16_4_;
      auVar128._20_4_ = auVar98._20_4_ + auVar106._20_4_;
      auVar128._24_4_ = auVar98._24_4_ + auVar106._24_4_;
      auVar128._28_4_ = auVar98._28_4_ + auVar106._28_4_;
      auVar130._0_4_ = auVar101._0_4_ + auVar112._0_4_;
      auVar130._4_4_ = auVar101._4_4_ + auVar112._4_4_;
      auVar130._8_4_ = auVar101._8_4_ + auVar112._8_4_;
      auVar130._12_4_ = auVar101._12_4_ + auVar112._12_4_;
      auVar130._16_4_ = auVar101._16_4_ + auVar112._16_4_;
      auVar130._20_4_ = auVar101._20_4_ + auVar112._20_4_;
      auVar130._24_4_ = auVar101._24_4_ + auVar112._24_4_;
      auVar130._28_4_ = auVar101._28_4_ + auVar112._28_4_;
      auVar98 = vaddps_avx512vl(auVar93,auVar117);
      auVar101 = vmulps_avx512vl(auVar92,local_80);
      auVar106 = vmulps_avx512vl(auVar92,local_a0);
      auVar112 = vmulps_avx512vl(auVar96,auVar92);
      bVar75 = (byte)uVar83;
      bVar24 = (bool)((byte)(uVar83 >> 1) & 1);
      bVar30 = (bool)((byte)(uVar83 >> 2) & 1);
      bVar40 = (bool)((byte)(uVar83 >> 3) & 1);
      bVar34 = (bool)((byte)(uVar83 >> 4) & 1);
      bVar41 = (bool)((byte)(uVar83 >> 5) & 1);
      bVar48 = (bool)((byte)(uVar83 >> 6) & 1);
      bVar55 = SUB81(uVar83 >> 7,0);
      bVar25 = (bool)((byte)(uVar83 >> 1) & 1);
      bVar31 = (bool)((byte)(uVar83 >> 2) & 1);
      bVar46 = (bool)((byte)(uVar83 >> 3) & 1);
      bVar35 = (bool)((byte)(uVar83 >> 4) & 1);
      bVar42 = (bool)((byte)(uVar83 >> 5) & 1);
      bVar49 = (bool)((byte)(uVar83 >> 6) & 1);
      bVar56 = SUB81(uVar83 >> 7,0);
      bVar26 = (bool)((byte)(uVar83 >> 1) & 1);
      bVar32 = (bool)((byte)(uVar83 >> 2) & 1);
      bVar47 = (bool)((byte)(uVar83 >> 3) & 1);
      bVar36 = (bool)((byte)(uVar83 >> 4) & 1);
      bVar43 = (bool)((byte)(uVar83 >> 5) & 1);
      bVar50 = (bool)((byte)(uVar83 >> 6) & 1);
      bVar57 = SUB81(uVar83 >> 7,0);
      auVar101 = vsubps_avx512vl(auVar128,auVar101);
      bVar27 = (bool)(bVar84 >> 1 & 1);
      bVar33 = (bool)(bVar84 >> 2 & 1);
      bVar53 = (bool)(bVar84 >> 3 & 1);
      bVar37 = (bool)(bVar84 >> 4 & 1);
      bVar44 = (bool)(bVar84 >> 5 & 1);
      bVar51 = (bool)(bVar84 >> 6 & 1);
      auVar106 = vsubps_avx512vl(auVar130,auVar106);
      bVar28 = (bool)(bVar84 >> 1 & 1);
      bVar39 = (bool)(bVar84 >> 2 & 1);
      bVar54 = (bool)(bVar84 >> 3 & 1);
      bVar38 = (bool)(bVar84 >> 4 & 1);
      bVar45 = (bool)(bVar84 >> 5 & 1);
      bVar52 = (bool)(bVar84 >> 6 & 1);
      auVar98 = vsubps_avx512vl(auVar98,auVar112);
      local_3c0._0_4_ =
           (uint)(bVar84 & 1) * auVar98._0_4_ |
           (uint)!(bool)(bVar84 & 1) *
           ((uint)(bVar75 & 1) * local_e0._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar105._0_4_);
      bVar29 = (bool)(bVar84 >> 1 & 1);
      local_3c0._4_4_ =
           (uint)bVar29 * auVar98._4_4_ |
           (uint)!bVar29 * ((uint)bVar26 * local_e0._4_4_ | (uint)!bVar26 * auVar105._4_4_);
      bVar26 = (bool)(bVar84 >> 2 & 1);
      local_3c0._8_4_ =
           (uint)bVar26 * auVar98._8_4_ |
           (uint)!bVar26 * ((uint)bVar32 * local_e0._8_4_ | (uint)!bVar32 * auVar105._8_4_);
      bVar26 = (bool)(bVar84 >> 3 & 1);
      local_3c0._12_4_ =
           (uint)bVar26 * auVar98._12_4_ |
           (uint)!bVar26 * ((uint)bVar47 * local_e0._12_4_ | (uint)!bVar47 * auVar105._12_4_);
      bVar26 = (bool)(bVar84 >> 4 & 1);
      local_3c0._16_4_ =
           (uint)bVar26 * auVar98._16_4_ |
           (uint)!bVar26 * ((uint)bVar36 * local_e0._16_4_ | (uint)!bVar36 * auVar105._16_4_);
      bVar26 = (bool)(bVar84 >> 5 & 1);
      local_3c0._20_4_ =
           (uint)bVar26 * auVar98._20_4_ |
           (uint)!bVar26 * ((uint)bVar43 * local_e0._20_4_ | (uint)!bVar43 * auVar105._20_4_);
      bVar26 = (bool)(bVar84 >> 6 & 1);
      local_3c0._24_4_ =
           (uint)bVar26 * auVar98._24_4_ |
           (uint)!bVar26 * ((uint)bVar50 * local_e0._24_4_ | (uint)!bVar50 * auVar105._24_4_);
      local_3c0._28_4_ =
           (uint)(bVar84 >> 7) * auVar98._28_4_ |
           (uint)!(bool)(bVar84 >> 7) *
           ((uint)bVar57 * local_e0._28_4_ | (uint)!bVar57 * auVar105._28_4_);
      auVar97 = vmulps_avx512vl(auVar92,auVar97);
      bVar26 = (bool)(bVar84 >> 1 & 1);
      bVar29 = (bool)(bVar84 >> 2 & 1);
      bVar32 = (bool)(bVar84 >> 3 & 1);
      bVar47 = (bool)(bVar84 >> 4 & 1);
      bVar36 = (bool)(bVar84 >> 5 & 1);
      bVar43 = (bool)(bVar84 >> 6 & 1);
      local_460._4_4_ = (uint)bVar26 * auVar97._4_4_ | (uint)!bVar26 * auVar94._4_4_;
      local_460._0_4_ =
           (uint)(bVar84 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar94._0_4_;
      local_460._8_4_ = (uint)bVar29 * auVar97._8_4_ | (uint)!bVar29 * auVar94._8_4_;
      local_460._12_4_ = (uint)bVar32 * auVar97._12_4_ | (uint)!bVar32 * auVar94._12_4_;
      local_460._16_4_ = (uint)bVar47 * auVar97._16_4_ | (uint)!bVar47 * auVar94._16_4_;
      local_460._20_4_ = (uint)bVar36 * auVar97._20_4_ | (uint)!bVar36 * auVar94._20_4_;
      local_460._24_4_ = (uint)bVar43 * auVar97._24_4_ | (uint)!bVar43 * auVar94._24_4_;
      local_460._28_4_ =
           (uint)(bVar84 >> 7) * auVar97._28_4_ | (uint)!(bool)(bVar84 >> 7) * auVar94._28_4_;
      local_440 = ZEXT432(0) << 0x20;
      local_420 = auVar124;
      local_400._4_4_ =
           (uint)bVar27 * auVar101._4_4_ |
           (uint)!bVar27 * ((uint)bVar24 * local_c0._4_4_ | (uint)!bVar24 * auVar103._4_4_);
      local_400._0_4_ =
           (uint)(bVar84 & 1) * auVar101._0_4_ |
           (uint)!(bool)(bVar84 & 1) *
           ((uint)(bVar75 & 1) * local_c0._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar103._0_4_);
      local_400._8_4_ =
           (uint)bVar33 * auVar101._8_4_ |
           (uint)!bVar33 * ((uint)bVar30 * local_c0._8_4_ | (uint)!bVar30 * auVar103._8_4_);
      local_400._12_4_ =
           (uint)bVar53 * auVar101._12_4_ |
           (uint)!bVar53 * ((uint)bVar40 * local_c0._12_4_ | (uint)!bVar40 * auVar103._12_4_);
      local_400._16_4_ =
           (uint)bVar37 * auVar101._16_4_ |
           (uint)!bVar37 * ((uint)bVar34 * local_c0._16_4_ | (uint)!bVar34 * auVar103._16_4_);
      local_400._20_4_ =
           (uint)bVar44 * auVar101._20_4_ |
           (uint)!bVar44 * ((uint)bVar41 * local_c0._20_4_ | (uint)!bVar41 * auVar103._20_4_);
      local_400._24_4_ =
           (uint)bVar51 * auVar101._24_4_ |
           (uint)!bVar51 * ((uint)bVar48 * local_c0._24_4_ | (uint)!bVar48 * auVar103._24_4_);
      local_400._28_4_ =
           (uint)(bVar84 >> 7) * auVar101._28_4_ |
           (uint)!(bool)(bVar84 >> 7) *
           ((uint)bVar55 * local_c0._28_4_ | (uint)!bVar55 * auVar103._28_4_);
      local_3e0._4_4_ =
           (uint)bVar28 * auVar106._4_4_ |
           (uint)!bVar28 * ((uint)bVar25 * auVar102._4_4_ | (uint)!bVar25 * auVar104._4_4_);
      local_3e0._0_4_ =
           (uint)(bVar84 & 1) * auVar106._0_4_ |
           (uint)!(bool)(bVar84 & 1) *
           ((uint)(bVar75 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar104._0_4_);
      local_3e0._8_4_ =
           (uint)bVar39 * auVar106._8_4_ |
           (uint)!bVar39 * ((uint)bVar31 * auVar102._8_4_ | (uint)!bVar31 * auVar104._8_4_);
      local_3e0._12_4_ =
           (uint)bVar54 * auVar106._12_4_ |
           (uint)!bVar54 * ((uint)bVar46 * auVar102._12_4_ | (uint)!bVar46 * auVar104._12_4_);
      local_3e0._16_4_ =
           (uint)bVar38 * auVar106._16_4_ |
           (uint)!bVar38 * ((uint)bVar35 * auVar102._16_4_ | (uint)!bVar35 * auVar104._16_4_);
      local_3e0._20_4_ =
           (uint)bVar45 * auVar106._20_4_ |
           (uint)!bVar45 * ((uint)bVar42 * auVar102._20_4_ | (uint)!bVar42 * auVar104._20_4_);
      local_3e0._24_4_ =
           (uint)bVar52 * auVar106._24_4_ |
           (uint)!bVar52 * ((uint)bVar49 * auVar102._24_4_ | (uint)!bVar49 * auVar104._24_4_);
      local_3e0._28_4_ =
           (uint)(bVar84 >> 7) * auVar106._28_4_ |
           (uint)!(bool)(bVar84 >> 7) *
           ((uint)bVar56 * auVar102._28_4_ | (uint)!bVar56 * auVar104._28_4_);
      pSVar20 = context->scene;
      uVar83 = (ulong)(bVar85 & bVar76);
      auVar96 = vpcmpeqd_avx2(auVar96,auVar96);
      auVar162 = ZEXT3264(auVar96);
      do {
        local_590.valid = (int *)local_5b0;
        uVar74 = 0;
        for (uVar87 = uVar83; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000) {
          uVar74 = uVar74 + 1;
        }
        pGVar21 = (pSVar20->geometries).items[*(uint *)(local_100 + uVar74 * 4)].ptr;
        if ((pGVar21->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar85 = 1, pGVar21->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_0198312d;
          uVar87 = (ulong)(uint)((int)uVar74 * 4);
          uVar11 = *(undefined4 *)(local_460 + uVar87);
          local_520._4_4_ = uVar11;
          local_520._0_4_ = uVar11;
          local_520._8_4_ = uVar11;
          local_520._12_4_ = uVar11;
          uVar11 = *(undefined4 *)(local_440 + uVar87);
          local_510._4_4_ = uVar11;
          local_510._0_4_ = uVar11;
          local_510._8_4_ = uVar11;
          local_510._12_4_ = uVar11;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_420 + uVar87);
          local_590.context = context->user;
          local_4f0 = vpbroadcastd_avx512vl();
          uVar11 = *(undefined4 *)((long)&(line->primIDs).field_0 + uVar87);
          local_500._4_4_ = uVar11;
          local_500._0_4_ = uVar11;
          local_500._8_4_ = uVar11;
          local_500._12_4_ = uVar11;
          uVar11 = *(undefined4 *)(local_400 + uVar87);
          local_550._4_4_ = uVar11;
          local_550._0_4_ = uVar11;
          local_550._8_4_ = uVar11;
          local_550._12_4_ = uVar11;
          uVar11 = *(undefined4 *)(local_3e0 + uVar87);
          local_540._4_4_ = uVar11;
          local_540._0_4_ = uVar11;
          local_540._8_4_ = uVar11;
          local_540._12_4_ = uVar11;
          uVar11 = *(undefined4 *)(local_3c0 + uVar87);
          local_530._4_4_ = uVar11;
          local_530._0_4_ = uVar11;
          local_530._8_4_ = uVar11;
          local_530._12_4_ = uVar11;
          uStack_4dc = (local_590.context)->instID[0];
          local_4e0 = uStack_4dc;
          uStack_4d8 = uStack_4dc;
          uStack_4d4 = uStack_4dc;
          uStack_4d0 = (local_590.context)->instPrimID[0];
          uStack_4cc = uStack_4d0;
          uStack_4c8 = uStack_4d0;
          uStack_4c4 = uStack_4d0;
          local_5b0 = auVar138._0_16_;
          local_590.geometryUserPtr = pGVar21->userPtr;
          local_590.hit = local_550;
          local_590.N = 4;
          local_590.ray = (RTCRayN *)ray;
          local_560 = local_5b0;
          if (pGVar21->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar96 = ZEXT1632(auVar162._0_16_);
            (*pGVar21->occlusionFilterN)(&local_590);
            auVar96 = vpcmpeqd_avx2(auVar96,auVar96);
            auVar162 = ZEXT3264(auVar96);
            auVar138 = ZEXT1664(local_560);
            ray = local_598;
          }
          uVar87 = vptestmd_avx512vl(local_5b0,local_5b0);
          if ((uVar87 & 0xf) != 0) {
            p_Var23 = context->args->filter;
            if ((p_Var23 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar21->field_8).field_0x2 & 0x40) != 0)))) {
              auVar96 = ZEXT1632(auVar162._0_16_);
              (*p_Var23)(&local_590);
              auVar96 = vpcmpeqd_avx2(auVar96,auVar96);
              auVar162 = ZEXT3264(auVar96);
              auVar138 = ZEXT1664(local_560);
              ray = local_598;
            }
            auVar89 = *(undefined1 (*) [16])(local_590.ray + 0x80);
            uVar87 = vptestmd_avx512vl(local_5b0,local_5b0);
            uVar87 = uVar87 & 0xf;
            auVar90 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar24 = (bool)((byte)uVar87 & 1);
            auVar91._0_4_ = (uint)bVar24 * auVar90._0_4_ | (uint)!bVar24 * auVar89._0_4_;
            bVar24 = (bool)((byte)(uVar87 >> 1) & 1);
            auVar91._4_4_ = (uint)bVar24 * auVar90._4_4_ | (uint)!bVar24 * auVar89._4_4_;
            bVar24 = (bool)((byte)(uVar87 >> 2) & 1);
            auVar91._8_4_ = (uint)bVar24 * auVar90._8_4_ | (uint)!bVar24 * auVar89._8_4_;
            bVar24 = SUB81(uVar87 >> 3,0);
            auVar91._12_4_ = (uint)bVar24 * auVar90._12_4_ | (uint)!bVar24 * auVar89._12_4_;
            *(undefined1 (*) [16])(local_590.ray + 0x80) = auVar91;
            if ((byte)uVar87 != 0) {
              bVar85 = 1;
              goto LAB_0198312d;
            }
          }
          *(undefined4 *)(ray + k * 4 + 0x80) = local_4c0._0_4_;
        }
        uVar83 = uVar83 ^ 1L << (uVar74 & 0x3f);
        if (uVar83 == 0) {
          bVar85 = 0;
LAB_0198312d:
          return (bool)(bVar82 | bVar85);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        return ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Occluded1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }